

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O1

int it_riff_am_process_sample(IT_SAMPLE *sample,DUMBFILE *f,int len,int ver)

{
  byte bVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int32 iVar9;
  void *pvVar10;
  sbyte sVar11;
  
  iVar2 = dumbfile_pos(f);
  if (len < 0x38) {
    return -1;
  }
  dumbfile_getnc((char *)sample,0x1c,f);
  sample->name[0x1c] = '\0';
  iVar3 = dumbfile_getc(f);
  iVar4 = dumbfile_getc(f);
  uVar5 = dumbfile_igetw(f);
  uVar6 = dumbfile_igetl(f);
  uVar7 = dumbfile_igetl(f);
  uVar8 = dumbfile_igetl(f);
  iVar9 = dumbfile_igetl(f);
  if (uVar6 == 0) {
    sample->flags = sample->flags & 0xfe;
  }
  else {
    if ((uVar5 & 0xffff7f43) != 0) {
      return -1;
    }
    sVar11 = (sbyte)((uVar5 & 4) >> 2);
    if (len < (int)((uVar6 << sVar11) + 0x38)) {
      return -1;
    }
    sample->flags = (byte)((uVar5 & 4) >> 1) | (byte)uVar5 >> 7;
    sample->length = uVar6;
    sample->loop_start = uVar7;
    sample->loop_end = uVar8;
    sample->C5_speed = iVar9;
    sample->default_volume = (uchar)iVar4;
    sample->default_pan = (byte)((uVar5 & 0x20) << 2) | (byte)iVar3;
    sample->filename[0] = '\0';
    sample->global_volume = '@';
    sample->vibrato_speed = '\0';
    sample->vibrato_depth = '\0';
    sample->vibrato_rate = '\0';
    sample->vibrato_waveform = '\0';
    sample->finetune = 0;
    sample->max_resampling_quality = -1;
    if ((uVar7 < uVar8 & (byte)uVar5 >> 3 & uVar8 <= uVar6) == 1) {
      sample->length = uVar8;
      bVar1 = sample->flags;
      sample->flags = bVar1 | 0x10;
      if ((uVar5 & 0x10) != 0) {
        sample->flags = bVar1 | 0x50;
      }
    }
    iVar3 = sample->length << sVar11;
    pvVar10 = malloc((long)iVar3);
    sample->data = pvVar10;
    if (pvVar10 == (void *)0x0) {
      return -1;
    }
    iVar4 = dumbfile_seek(f,(long)(iVar2 + 0x38),0);
    if (iVar4 != 0) {
      return -1;
    }
    dumbfile_getnc((char *)sample->data,iVar3,f);
  }
  return 0;
}

Assistant:

static int it_riff_am_process_sample( IT_SAMPLE * sample, DUMBFILE * f, int len, int ver )
{
	int header_length;
	int default_pan;
	int default_volume;
	int flags;
	int length;
	int length_bytes;
	int loop_start;
	int loop_end;
    int sample_rate;

    int32 start = dumbfile_pos( f );

	if ( ver == 0 )
    {
		if ( len < 0x38 )
			return -1;

		header_length = 0x38;

        dumbfile_getnc( (char *) sample->name, 28, f );
		sample->name[ 28 ] = 0;

        default_pan = dumbfile_getc( f );
        default_volume = dumbfile_getc( f );
        flags = dumbfile_igetw( f );
        length = dumbfile_igetl( f );
        loop_start = dumbfile_igetl( f );
        loop_end = dumbfile_igetl( f );
        sample_rate = dumbfile_igetl( f );
	}
	else
	{
		if (len < 4) return -1;

        header_length = dumbfile_igetl( f );
		if ( header_length < 0x40 )
			return -1;
		if ( header_length + 4 > len )
			return -1;

        start += 4;
		len -= 4;

        dumbfile_getnc( (char *) sample->name, 32, f );

        default_pan = dumbfile_igetw( f );
        default_volume = dumbfile_igetw( f );
        flags = dumbfile_igetw( f );
        dumbfile_skip( f, 2 );
        length = dumbfile_igetl( f );
        loop_start = dumbfile_igetl( f );
        loop_end = dumbfile_igetl( f );
        sample_rate = dumbfile_igetl( f );

		if ( default_pan > 0x7FFF || default_volume > 0x7FFF )
			return -1;

		default_pan = default_pan * 64 / 32767;
		default_volume = default_volume * 64 / 32767;
	}

	if ( ! length ) {
		sample->flags &= ~IT_SAMPLE_EXISTS;
		return 0;
	}

	if ( flags & ~( 0x8000 | 0x80 | 0x20 | 0x10 | 0x08 | 0x04 ) )
		return -1;

	length_bytes = length << ( ( flags & 0x04 ) >> 2 );

	if ( length_bytes + header_length > len )
		return -1;

	sample->flags = 0;

	if ( flags & 0x80 ) sample->flags |= IT_SAMPLE_EXISTS;
	if ( flags & 0x04 ) sample->flags |= IT_SAMPLE_16BIT;

	sample->length = length;
	sample->loop_start = loop_start;
	sample->loop_end = loop_end;
	sample->C5_speed = sample_rate;
	sample->default_volume = default_volume;
	sample->default_pan = default_pan | ( ( flags & 0x20 ) << 2 );
	sample->filename[0] = 0;
	sample->global_volume = 64;
	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = IT_VIBRATO_SINE;
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	if ( flags & 0x08 )
	{
		if (((unsigned int)sample->loop_end <= (unsigned int)sample->length) &&
			((unsigned int)sample->loop_start < (unsigned int)sample->loop_end))
		{
			sample->length = sample->loop_end;
			sample->flags |= IT_SAMPLE_LOOP;
			if ( flags & 0x10 ) sample->flags |= IT_SAMPLE_PINGPONG_LOOP;
		}
	}

	length_bytes = sample->length << ( ( flags & 0x04 ) >> 2 );

	sample->data = malloc( length_bytes );
	if ( ! sample->data )
		return -1;

    if ( dumbfile_seek( f, start + header_length, DFS_SEEK_SET ) )
        return -1;

    dumbfile_getnc( sample->data, length_bytes, f );

	return 0;
}